

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void aom_comp_avg_upsampled_pred_c
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,int subpel_search)

{
  int iVar1;
  ulong uVar2;
  
  aom_upsampled_pred_c
            (xd,cm,mi_row,mi_col,mv,comp_pred,width,height,subpel_x_q3,subpel_y_q3,ref,ref_stride,
             subpel_search);
  if (0 < height) {
    iVar1 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          comp_pred[uVar2] = (uint8_t)((uint)comp_pred[uVar2] + (uint)pred[uVar2] + 1 >> 1);
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      comp_pred = comp_pred + width;
      pred = pred + width;
      iVar1 = iVar1 + 1;
    } while (iVar1 != height);
  }
  return;
}

Assistant:

void aom_comp_avg_upsampled_pred_c(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                   int mi_row, int mi_col, const MV *const mv,
                                   uint8_t *comp_pred, const uint8_t *pred,
                                   int width, int height, int subpel_x_q3,
                                   int subpel_y_q3, const uint8_t *ref,
                                   int ref_stride, int subpel_search) {
  int i, j;

  aom_upsampled_pred_c(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                       subpel_x_q3, subpel_y_q3, ref, ref_stride,
                       subpel_search);
  for (i = 0; i < height; i++) {
    for (j = 0; j < width; j++) {
      comp_pred[j] = ROUND_POWER_OF_TWO(comp_pred[j] + pred[j], 1);
    }
    comp_pred += width;
    pred += width;
  }
}